

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_unknown_wid(ngram_model_t *model)

{
  int32 iVar1;
  int32 local_1c;
  ngram_model_t *pnStack_18;
  int32 val;
  ngram_model_t *model_local;
  
  pnStack_18 = model;
  iVar1 = hash_table_lookup_int32(model->wid,"<UNK>",&local_1c);
  if (iVar1 == -1) {
    model_local._4_4_ = -1;
  }
  else {
    model_local._4_4_ = local_1c;
  }
  return model_local._4_4_;
}

Assistant:

int32
ngram_unknown_wid(ngram_model_t * model)
{
    int32 val;

    /* FIXME: This could be memoized for speed if necessary. */
    /* Look up <UNK>, if not found return NGRAM_INVALID_WID. */
    if (hash_table_lookup_int32(model->wid, "<UNK>", &val) == -1)
        return NGRAM_INVALID_WID;
    else
        return val;
}